

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

array<float,_4UL> __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::readFloat4
          (GLFrameBuffer *this,int xPos,int yPos)

{
  array<float,_4UL> result;
  
  (*glad_glFlush)();
  (*glad_glFinish)();
  (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
  (*glad_glReadPixels)(xPos,yPos,1,1,0x1908,0x1406,&result);
  return (array<float,_4UL>)result._M_elems;
}

Assistant:

std::array<float, 4> GLFrameBuffer::readFloat4(int xPos, int yPos) {

  // if (colorRenderBuffer == nullptr || colorRenderBuffer->getType() != RenderBufferType::Float4) {
  // exception("OpenGL error: buffer is not of right type to read float4 from");
  //}

  glFlush();
  glFinish();
  bind();

  // Read from the buffer
  std::array<float, 4> result;
  glReadPixels(xPos, yPos, 1, 1, GL_RGBA, GL_FLOAT, &result);

  return result;
}